

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_client.cc
# Opt level: O1

int main(void)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Base_ptr *pp_Var4;
  int iVar5;
  size_t sVar6;
  Builder<prometheus::Counter> *pBVar7;
  Family<prometheus::Counter> *this;
  Counter *this_00;
  int *piVar8;
  long *plVar9;
  long lVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  allocator_type local_5ca;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_5c9;
  shared_ptr<prometheus::Registry> registry;
  string local_5b8;
  string local_598;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_578;
  string local_538;
  undefined1 local_518 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_510;
  char local_508 [48];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_498;
  Labels labels;
  Gateway gateway;
  
  iVar5 = gethostname((char *)&gateway,0x400);
  paVar11 = &local_538.field_2;
  local_538._M_dataplus._M_p = (pointer)paVar11;
  if (iVar5 == 0) {
    sVar6 = strlen((char *)&gateway);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_538,&gateway,(long)&gateway.jobUri_._M_dataplus._M_p + sVar6);
  }
  else {
    local_538._M_string_length = 0;
    local_538.field_2._M_local_buf[0] = '\0';
  }
  prometheus::Gateway::GetInstanceLabel(&labels,&local_538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != paVar11) {
    operator_delete(local_538._M_dataplus._M_p);
  }
  local_518 = (undefined1  [8])local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"127.0.0.1","");
  paVar11 = &local_578.first.field_2;
  local_578.first._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"9091","");
  pp_Var4 = &local_498._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_498._M_impl._0_8_ = pp_Var4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"sample_client","");
  paVar2 = &local_5b8.field_2;
  local_5b8._M_string_length = 0;
  local_5b8.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_598.field_2;
  local_598._M_string_length = 0;
  local_598.field_2._M_local_buf[0] = '\0';
  local_5b8._M_dataplus._M_p = (pointer)paVar2;
  local_598._M_dataplus._M_p = (pointer)paVar3;
  prometheus::Gateway::Gateway
            (&gateway,(string *)local_518,&local_578.first,(string *)&local_498,&labels,&local_5b8,
             &local_598,(seconds)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != paVar3) {
    operator_delete(local_598._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_5b8._M_dataplus._M_p);
  }
  if ((_Base_ptr *)local_498._M_impl._0_8_ != pp_Var4) {
    operator_delete((void *)local_498._M_impl._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578.first._M_dataplus._M_p != paVar11) {
    operator_delete(local_578.first._M_dataplus._M_p);
  }
  if (local_518 != (undefined1  [8])local_508) {
    operator_delete((void *)local_518);
  }
  registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<prometheus::Registry,std::allocator<prometheus::Registry>>
            (&registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Registry **)&registry,(allocator<prometheus::Registry> *)local_518);
  prometheus::BuildCounter();
  local_5b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5b8,"time_running_seconds_total","");
  pBVar7 = prometheus::detail::Builder<prometheus::Counter>::Name
                     ((Builder<prometheus::Counter> *)local_518,&local_5b8);
  local_598._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_598,"How many seconds is this server running?","");
  pBVar7 = prometheus::detail::Builder<prometheus::Counter>::Help(pBVar7,&local_598);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[6],_true>
            (&local_578,(char (*) [6])0x119077,(char (*) [6])"value");
  __l._M_len = 1;
  __l._M_array = &local_578;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_498,__l,&local_5c9,&local_5ca);
  pBVar7 = prometheus::detail::Builder<prometheus::Counter>::Labels(pBVar7,(Labels *)&local_498);
  this = prometheus::detail::Builder<prometheus::Counter>::Register
                   (pBVar7,registry.
                           super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578.second._M_dataplus._M_p != &local_578.second.field_2) {
    operator_delete(local_578.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578.first._M_dataplus._M_p != paVar11) {
    operator_delete(local_578.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != paVar3) {
    operator_delete(local_598._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_5b8._M_dataplus._M_p);
  }
  prometheus::detail::Builder<prometheus::Counter>::~Builder
            ((Builder<prometheus::Counter> *)local_518);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_const_char_(&)[6],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_518,(char (*) [14])0x11906f,(char (*) [6])"value");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[6],_true>
            (&local_4d8,(char (*) [18])"yet_another_label",(char (*) [6])"value");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_518;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_578,__l_00,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_498,(allocator_type *)&local_5b8);
  this_00 = prometheus::Family<prometheus::Counter>::Add<>(this,(Labels *)&local_578);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_578);
  lVar10 = -0x80;
  paVar11 = &local_4d8.second.field_2;
  do {
    if (paVar11 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar11->_M_local_buf + -0x10)) {
      operator_delete(*(undefined1 **)(paVar11->_M_local_buf + -0x10));
    }
    if (paVar11->_M_local_buf + -0x20 != *(char **)(paVar11->_M_local_buf + -0x30)) {
      operator_delete(*(char **)(paVar11->_M_local_buf + -0x30));
    }
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(paVar11->_M_local_buf + -0x40);
    lVar10 = lVar10 + 0x40;
  } while (lVar10 != 0);
  local_518 = (undefined1  [8])
              registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_510._M_pi =
       registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count =
           (registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count =
           (registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  prometheus::Gateway::RegisterCollectable
            (&gateway,(weak_ptr<prometheus::Collectable> *)local_518,(Labels *)0x0);
  if (local_510._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_510._M_pi)->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = (local_510._M_pi)->_M_weak_count;
      (local_510._M_pi)->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*(local_510._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  local_518 = (undefined1  [8])local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"Foo:foo","");
  prometheus::Gateway::AddHttpHeader(&gateway,(string *)local_518);
  if (local_518 != (undefined1  [8])local_508) {
    operator_delete((void *)local_518);
  }
  do {
    local_518 = (undefined1  [8])0x1;
    local_510._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      iVar5 = nanosleep((timespec *)local_518,(timespec *)local_518);
      if (iVar5 != -1) break;
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
    prometheus::Counter::Increment(this_00);
    iVar5 = prometheus::Gateway::Push(&gateway);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"returnCode is ",0xe);
    plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
  } while( true );
}

Assistant:

int main() {
  using namespace prometheus;

  // create a push gateway
  const auto labels = Gateway::GetInstanceLabel(GetHostName());

  Gateway gateway{"127.0.0.1", "9091", "sample_client", labels};

  // create a metrics registry with component=main labels applied to all its
  // metrics
  auto registry = std::make_shared<Registry>();

  // add a new counter family to the registry (families combine values with the
  // same name, but distinct label dimensions)
  auto& counter_family = BuildCounter()
                             .Name("time_running_seconds_total")
                             .Help("How many seconds is this server running?")
                             .Labels({{"label", "value"}})
                             .Register(*registry);

  // add a counter to the metric family
  auto& second_counter = counter_family.Add(
      {{"another_label", "value"}, {"yet_another_label", "value"}});

  // ask the pusher to push the metrics to the pushgateway
  gateway.RegisterCollectable(registry);

  // add custom HTTP header
  gateway.AddHttpHeader("Foo:foo");

  for (;;) {
    std::this_thread::sleep_for(std::chrono::seconds(1));
    // increment the counter by one (second)
    second_counter.Increment();

    // push metrics
    auto returnCode = gateway.Push();
    std::cout << "returnCode is " << returnCode << std::endl;
  }
  return 0;
}